

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.c
# Opt level: O0

size_t layer_data_init(layer_t *l,data_val_t *buf,int level)

{
  size_t sVar1;
  data_val_t *pdVar2;
  data_val_t *start;
  int level_local;
  data_val_t *buf_local;
  layer_t *l_local;
  
  sVar1 = data_init(&l->in,buf,level,l->n->batch);
  pdVar2 = buf + sVar1;
  sVar1 = data_init(&l->weight,pdVar2,level,1);
  pdVar2 = pdVar2 + sVar1;
  sVar1 = data_init(&l->bias,pdVar2,level,1);
  pdVar2 = pdVar2 + sVar1;
  sVar1 = data_init(&l->extra,pdVar2,0,1);
  data_init(&l->out,pdVar2 + sVar1,level,l->n->batch);
  layer_fill_data(&l->weight_filler,&l->weight,(l->in).size,(l->out).size);
  layer_fill_data(&l->bias_filler,&l->bias,(l->in).size,(l->out).size);
  return (long)(pdVar2 + sVar1) - (long)buf >> 2;
}

Assistant:

size_t layer_data_init(layer_t *l, data_val_t *buf, int level)
{
	data_val_t *start = buf;

	buf += data_init(&l->in, buf, level, l->n->batch);
	buf += data_init(&l->weight, buf, level, 1);
	buf += data_init(&l->bias, buf, level, 1);
	buf += data_init(&l->extra, buf, 0, 1);
	/*  buf += */ data_init(&l->out, buf, level, l->n->batch);

	layer_fill_data(&l->weight_filler, &l->weight, l->in.size, l->out.size);
	layer_fill_data(&l->bias_filler, &l->bias, l->in.size, l->out.size);

	return buf - start;
}